

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printVar(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  uint x;
  ulong uVar3;
  Ref local_38;
  Ref node_local;
  Ref args;
  
  local_38.inst = node.inst;
  emit(this,"var ");
  pRVar2 = Ref::operator[](&local_38,1);
  node_local.inst = pRVar2->inst;
  if ((node_local.inst)->type == Array) {
    uVar3 = 0;
    do {
      if (((((node_local.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar3) {
        return;
      }
      if (uVar3 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
      }
      x = (uint)uVar3;
      pRVar2 = Ref::operator[](&node_local,x);
      pRVar2 = Ref::operator[](pRVar2,0);
      if (pRVar2->inst->type != String) {
        __assert_fail("isString()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0xeb,"const char *cashew::Value::getCString()");
      }
      emit(this,(pRVar2->inst->field_1).str.str._M_str);
      pRVar2 = Ref::operator[](&node_local,x);
      if (pRVar2->inst->type != Array) break;
      if (1 < (((pRVar2->inst->field_1).arr)->
              super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements) {
        space(this);
        maybeSpace(this,'=');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '=';
        space(this);
        pRVar2 = Ref::operator[](&node_local,x);
        pRVar2 = Ref::operator[](pRVar2,1);
        print(this,pRVar2->inst);
      }
      uVar3 = uVar3 + 1;
    } while ((node_local.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printVar(Ref node) {
    emit("var ");
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i][0]->getCString());
      if (args[i]->size() > 1) {
        space();
        emit('=');
        space();
        print(args[i][1]);
      }
    }
  }